

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::PhiInst::display(PhiInst *this,ostream *o)

{
  pointer pVVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::operator<<(o," = phi [");
  lVar2 = 0;
  for (uVar3 = 0;
      pVVar1 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->vars).
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4);
      uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::operator<<(o,", ");
      pVVar1 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    (*(code *)**(undefined8 **)((long)&(pVVar1->super_Displayable)._vptr_Displayable + lVar2))
              ((long)&(pVVar1->super_Displayable)._vptr_Displayable + lVar2,o);
    lVar2 = lVar2 + 0x10;
  }
  std::operator<<(o,"]");
  return;
}

Assistant:

void PhiInst::display(std::ostream& o) const {
  o << dest << " = phi [";
  for (size_t i = 0; i < vars.size(); i++) {
    if (i != 0) o << ", ";
    o << vars[i];
  }
  o << "]";
}